

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

size_t UnwrittenBytes(BrotliDecoderStateInternal *s,int wrap)

{
  int iVar1;
  long local_30;
  size_t partial_pos_rb;
  size_t pos;
  int wrap_local;
  BrotliDecoderStateInternal *s_local;
  
  if ((wrap == 0) || (s->pos <= s->ringbuffer_size)) {
    iVar1 = s->pos;
  }
  else {
    iVar1 = s->ringbuffer_size;
  }
  local_30 = (long)iVar1;
  return (s->rb_roundtrips * (long)s->ringbuffer_size + local_30) - s->partial_pos_out;
}

Assistant:

static size_t UnwrittenBytes(const BrotliDecoderState* s, BROTLI_BOOL wrap) {
  size_t pos = wrap && s->pos > s->ringbuffer_size ?
      (size_t)s->ringbuffer_size : (size_t)(s->pos);
  size_t partial_pos_rb = (s->rb_roundtrips * (size_t)s->ringbuffer_size) + pos;
  return partial_pos_rb - s->partial_pos_out;
}